

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEmitter.cpp
# Opt level: O0

void __thiscall CodeEmitter::emitterError(CodeEmitter *this,string *errorMessage)

{
  ostream *poVar1;
  CodeEmitterError *this_00;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  string *local_18;
  string *errorMessage_local;
  CodeEmitter *this_local;
  
  local_18 = errorMessage;
  errorMessage_local = (string *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Code emitter error: ");
  std::operator<<(poVar1,(string *)errorMessage);
  this_00 = (CodeEmitterError *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  CodeEmitterError::CodeEmitterError(this_00,local_1d0);
  __cxa_throw(this_00,&CodeEmitterError::typeinfo,CodeEmitterError::~CodeEmitterError);
}

Assistant:

void CodeEmitter::emitterError(std::string errorMessage) {
    std::stringstream ss;
    ss << "Code emitter error: " << errorMessage;
    throw CodeEmitterError{ ss.str() };
}